

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O3

void __thiscall CChromeTracer::~CChromeTracer(CChromeTracer *this)

{
  long lVar1;
  undefined8 uVar2;
  ostream *poVar3;
  
  flush(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->m_TraceFile,"{\"ph\":\"M\",\"name\":\"clintercept_eof\",\"pid\":",
             0x29);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&this->m_TraceFile);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\"tid\":0",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\n",2);
  std::ofstream::close();
  std::vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>::~vector
            (&this->m_RecordBuffer);
  uVar2 = _dlclose;
  lVar1 = _VTT;
  *(long *)&this->m_TraceFile = _VTT;
  *(undefined8 *)(&this->m_TraceFile + *(long *)(lVar1 + -0x18)) = uVar2;
  std::filebuf::~filebuf((filebuf *)&this->field_0x48);
  std::ios_base::~ios_base((ios_base *)&this->field_0x138);
  return;
}

Assistant:

~CChromeTracer()
    {
        flush();

        // Add an eof metadata event without a trailing comma to properly end
        // the json file.
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"clintercept_eof\",\"pid\":" << m_ProcessId
            << ",\"tid\":0"
            << "}\n"
            << "]\n";
        m_TraceFile.close();
    }